

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbolNotEnforcingDeps
          (DescriptorBuilder *this,string *name,bool build_it)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  Symbol SVar4;
  pair<std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>,_std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>_>
  pVar5;
  FileDescriptor *file;
  Symbol result;
  FileDescriptor *local_20;
  Symbol local_18;
  
  SVar4 = FindSymbolNotEnforcingDepsHelper(this,this->pool_,name,build_it);
  local_18.field_1 = SVar4.field_1;
  local_18.type = SVar4.type;
  local_20 = Symbol::GetFile(&local_18);
  if (local_20 != this->file_) {
    p_Var1 = &(this->dependencies_)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var2 = &p_Var1->_M_header;
    for (; p_Var3 != (_Base_ptr)0x0;
        p_Var3 = (&p_Var3->_M_left)[*(FileDescriptor **)(p_Var3 + 1) < local_20]) {
      if (*(FileDescriptor **)(p_Var3 + 1) >= local_20) {
        p_Var2 = p_Var3;
      }
    }
    p_Var3 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var2 != p_Var1) &&
       (p_Var3 = p_Var2, local_20 < *(FileDescriptor **)(p_Var2 + 1))) {
      p_Var3 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var3 == p_Var1) goto LAB_002d2ad4;
  }
  pVar5 = std::
          _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::equal_range(&(this->unused_dependency_)._M_t,&local_20);
  std::
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::_M_erase_aux(&(this->unused_dependency_)._M_t,(_Base_ptr)pVar5.first._M_node,
                 (_Base_ptr)pVar5.second._M_node);
LAB_002d2ad4:
  SVar4._4_4_ = 0;
  SVar4.type = local_18.type;
  SVar4.field_1.descriptor = local_18.field_1.descriptor;
  return SVar4;
}

Assistant:

Symbol DescriptorBuilder::FindSymbolNotEnforcingDeps(const std::string& name,
                                                     bool build_it) {
  Symbol result = FindSymbolNotEnforcingDepsHelper(pool_, name, build_it);
  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.count(file) > 0) {
    unused_dependency_.erase(file);
  }
  return result;
}